

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.cpp
# Opt level: O1

void __thiscall particle::collideBox(particle *this,vec2f *box,float *r)

{
  floatingType *pfVar1;
  float fVar2;
  
  fVar2 = (this->position).x;
  if (((fVar2 < *r) && ((this->velocity).x <= 0.0 && (this->velocity).x != 0.0)) ||
     ((box->x - *r < fVar2 && (0.0 < (this->velocity).x)))) {
    (this->velocity).x = -(this->velocity).x;
  }
  fVar2 = (this->position).y;
  if (((fVar2 < *r) && (pfVar1 = &(this->velocity).y, *pfVar1 <= 0.0 && *pfVar1 != 0.0)) ||
     ((box->y - *r < fVar2 && (0.0 < (this->velocity).y)))) {
    (this->velocity).y = -(this->velocity).y;
  }
  return;
}

Assistant:

void particle::collideBox(const vec2f& box, const float& r)
{
    if((position.getX() < 0 + r && velocity.getX() < 0)
       || (position.getX() > box.getX() - r && velocity.getX() > 0))
        velocity.setX(-velocity.getX());
    if((position.getY() < 0 + r && velocity.getY() < 0)
       || (position.getY() > box.getY() - r && velocity.getY() > 0))
        velocity.setY(-velocity.getY());
}